

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O3

void __thiscall DatalogDatabase::dump_rules(DatalogDatabase *this,ostream *out)

{
  pointer ppRVar1;
  ostream *poVar2;
  long *plVar3;
  ulong uVar4;
  string local_50;
  
  ppRVar1 = (this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppRVar1) {
    uVar4 = 0;
    do {
      Rule::toString_abi_cxx11_(&local_50,ppRVar1[uVar4]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      plVar3 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar4 = uVar4 + 1;
      ppRVar1 = (this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3))
    ;
  }
  return;
}

Assistant:

void DatalogDatabase::dump_rules(ostream& out)
{
  for (size_t k = 0; k < rules.size(); k++)
  {
    out << rules[k]->toString() << endl << endl;
  }
}